

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int geopolyOverlap(GeoPoly *p1,GeoPoly *p2)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  GeoOverlap *p;
  GeoEvent *pRight;
  GeoEvent *pGVar5;
  GeoSegment *pRight_00;
  GeoSegment *pGVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  GeoSegment *pGVar12;
  GeoSegment *pGVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  double dVar18;
  undefined4 local_1cc;
  GeoEvent *a [50];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (long)(p1->nVertex + p2->nVertex + 2);
  p = (GeoOverlap *)sqlite3_malloc64(lVar8 * 0x70 + 0x18);
  if (p == (GeoOverlap *)0x0) {
    iVar7 = -1;
  }
  else {
    p->aEvent = (GeoEvent *)(p + 1);
    p->aSegment = (GeoSegment *)((long)p + lVar8 * 0x40 + 0x18);
    p->nEvent = 0;
    p->nSegment = 0;
    geopolyAddSegments(p,p1,'\x01');
    geopolyAddSegments(p,p2,'\x02');
    pGVar5 = p->aEvent;
    uVar16 = p->nEvent;
    memset(a,0xaa,400);
    uVar15 = 0;
    uVar10 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar10 = uVar15;
    }
    uVar17 = 0;
    for (; uVar16 = (uint)uVar17, uVar15 != uVar10; uVar15 = uVar15 + 1) {
      pGVar5[uVar15].pNext = (GeoEvent *)0x0;
      pRight = pGVar5 + uVar15;
      lVar8 = (long)(int)uVar16;
      uVar14 = 0;
      if (0 < (int)uVar16) {
        uVar14 = uVar16;
      }
      lVar11 = 0;
      if (0 < lVar8) {
        lVar11 = lVar8;
      }
      for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 1) {
        if (a[lVar9] == (GeoEvent *)0x0) {
          uVar14 = (uint)lVar9;
          lVar11 = lVar9;
          break;
        }
        pRight = geopolyEventMerge(a[lVar9],pRight);
        a[lVar9] = (GeoEvent *)0x0;
      }
      a[uVar14] = pRight;
      if (lVar8 <= lVar11) {
        uVar17 = (ulong)(uVar14 + 1);
      }
    }
    uVar10 = 0;
    if ((int)uVar16 < 1) {
      uVar17 = 0;
    }
    pGVar5 = (GeoEvent *)0x0;
    for (; uVar17 != uVar10; uVar10 = uVar10 + 1) {
      pGVar5 = geopolyEventMerge(a[uVar10],pGVar5);
    }
    if (pGVar5 == (GeoEvent *)0x0) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = (double)(-(ulong)(pGVar5->x == 0.0) & 0xbff0000000000000);
    }
    local_1cc = 0;
    bVar4 = false;
    pRight_00 = (GeoSegment *)0x0;
    for (; pGVar5 != (GeoEvent *)0x0; pGVar5 = pGVar5->pNext) {
      dVar1 = pGVar5->x;
      if ((dVar1 != dVar18) || (NAN(dVar1) || NAN(dVar18))) {
        if (bVar4) {
          memset(a,0xaa,400);
          uVar10 = 0;
          while (uVar16 = (uint)uVar10, pRight_00 != (GeoSegment *)0x0) {
            pGVar6 = pRight_00->pNext;
            pRight_00->pNext = (GeoSegment *)0x0;
            lVar8 = (long)(int)uVar16;
            uVar14 = 0;
            if (0 < (int)uVar16) {
              uVar14 = uVar16;
            }
            lVar11 = 0;
            if (0 < lVar8) {
              lVar11 = lVar8;
            }
            for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 1) {
              if ((GeoSegment *)a[lVar9] == (GeoSegment *)0x0) {
                uVar14 = (uint)lVar9;
                lVar11 = lVar9;
                break;
              }
              pRight_00 = geopolySegmentMerge((GeoSegment *)a[lVar9],pRight_00);
              a[lVar9] = (GeoEvent *)0x0;
            }
            a[uVar14] = (GeoEvent *)pRight_00;
            pRight_00 = pGVar6;
            if (lVar8 <= lVar11) {
              uVar10 = (ulong)(uVar14 + 1);
            }
          }
          if ((int)uVar16 < 1) {
            uVar10 = 0;
          }
          pRight_00 = (GeoSegment *)0x0;
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            pRight_00 = geopolySegmentMerge((GeoSegment *)a[uVar15],pRight_00);
          }
        }
        uVar10 = 0;
        pGVar6 = (GeoSegment *)0x0;
        for (pGVar12 = pRight_00; pGVar12 != (GeoSegment *)0x0; pGVar12 = pGVar12->pNext) {
          if (pGVar6 != (GeoSegment *)0x0) {
            if ((pGVar6->y != pGVar12->y) || (NAN(pGVar6->y) || NAN(pGVar12->y))) {
              *(undefined1 *)((long)a + (uVar10 - 4)) = 1;
            }
          }
          uVar10 = (ulong)((uint)uVar10 ^ (uint)pGVar12->side);
          pGVar6 = pGVar12;
        }
        pGVar6 = (GeoSegment *)0x0;
        for (pGVar12 = pRight_00; pGVar12 != (GeoSegment *)0x0; pGVar12 = pGVar12->pNext) {
          dVar18 = pGVar12->C * dVar1 + pGVar12->B;
          pGVar12->y = dVar18;
          if (pGVar6 != (GeoSegment *)0x0) {
            dVar2 = pGVar6->y;
            if ((dVar18 < dVar2) && (pGVar6->side != pGVar12->side)) {
              iVar7 = 1;
              goto LAB_001de79e;
            }
            if ((dVar2 != dVar18) || (NAN(dVar2) || NAN(dVar18))) {
              *(undefined1 *)((long)a + (uVar10 - 4)) = 1;
            }
          }
          uVar10 = (ulong)((uint)uVar10 ^ (uint)pGVar12->side);
          pGVar6 = pGVar12;
        }
        bVar4 = false;
        dVar18 = dVar1;
      }
      pGVar6 = pGVar5->pSeg;
      if (pGVar5->eType == 0) {
        pGVar6->y = (double)pGVar6->y0;
        pGVar6->pNext = pRight_00;
        bVar4 = true;
        pRight_00 = pGVar6;
      }
      else {
        pGVar12 = pRight_00;
        if (pRight_00 == pGVar6) {
          if (pRight_00 == (GeoSegment *)0x0) {
            pRight_00 = (GeoSegment *)0x0;
          }
          else {
            pRight_00 = pRight_00->pNext;
          }
        }
        else {
          do {
            pGVar13 = pGVar12;
            if (pGVar13 == (GeoSegment *)0x0) goto LAB_001de78d;
            pGVar12 = pGVar13->pNext;
          } while (pGVar12 != pGVar6);
          if (pGVar6 == (GeoSegment *)0x0) {
            pGVar6 = (GeoSegment *)0x0;
          }
          else {
            pGVar6 = pGVar12->pNext;
          }
          pGVar13->pNext = pGVar6;
        }
      }
LAB_001de78d:
    }
    if (local_1cc._3_1_ == '\0') {
      iVar7 = 0;
    }
    else if (local_1cc._1_1_ == '\0' || local_1cc._2_1_ != '\0') {
      iVar7 = 2;
      if (local_1cc._1_1_ != '\0' || local_1cc._2_1_ == '\0') {
        iVar7 = (uint)(local_1cc._1_1_ == '\0' && local_1cc._2_1_ == '\0') * 3 + 1;
      }
    }
    else {
      iVar7 = 3;
    }
LAB_001de79e:
    sqlite3_free(p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int geopolyOverlap(GeoPoly *p1, GeoPoly *p2){
  sqlite3_int64 nVertex = p1->nVertex + p2->nVertex + 2;
  GeoOverlap *p;
  sqlite3_int64 nByte;
  GeoEvent *pThisEvent;
  double rX;
  int rc = 0;
  int needSort = 0;
  GeoSegment *pActive = 0;
  GeoSegment *pSeg;
  unsigned char aOverlap[4];

  nByte = sizeof(GeoEvent)*nVertex*2
           + sizeof(GeoSegment)*nVertex
           + sizeof(GeoOverlap);
  p = sqlite3_malloc64( nByte );
  if( p==0 ) return -1;
  p->aEvent = (GeoEvent*)&p[1];
  p->aSegment = (GeoSegment*)&p->aEvent[nVertex*2];
  p->nEvent = p->nSegment = 0;
  geopolyAddSegments(p, p1, 1);
  geopolyAddSegments(p, p2, 2);
  pThisEvent = geopolySortEventsByX(p->aEvent, p->nEvent);
  rX = pThisEvent && pThisEvent->x==0.0 ? -1.0 : 0.0;
  memset(aOverlap, 0, sizeof(aOverlap));
  while( pThisEvent ){
    if( pThisEvent->x!=rX ){
      GeoSegment *pPrev = 0;
      int iMask = 0;
      GEODEBUG(("Distinct X: %g\n", pThisEvent->x));
      rX = pThisEvent->x;
      if( needSort ){
        GEODEBUG(("SORT\n"));
        pActive = geopolySortSegmentsByYAndC(pActive);
        needSort = 0;
      }
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        if( pPrev ){
          if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
      pPrev = 0;
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        double y = pSeg->C*rX + pSeg->B;
        GEODEBUG(("Segment %d.%d %g->%g\n", pSeg->side, pSeg->idx, pSeg->y, y));
        pSeg->y = y;
        if( pPrev ){
          if( pPrev->y>pSeg->y && pPrev->side!=pSeg->side ){
            rc = 1;
            GEODEBUG(("Crossing: %d.%d and %d.%d\n",
                    pPrev->side, pPrev->idx,
                    pSeg->side, pSeg->idx));
            goto geopolyOverlapDone;
          }else if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
    }
    GEODEBUG(("%s %d.%d C=%g B=%g\n",
      pThisEvent->eType ? "RM " : "ADD",
      pThisEvent->pSeg->side, pThisEvent->pSeg->idx,
      pThisEvent->pSeg->C,
      pThisEvent->pSeg->B));
    if( pThisEvent->eType==0 ){
      /* Add a segment */
      pSeg = pThisEvent->pSeg;
      pSeg->y = pSeg->y0;
      pSeg->pNext = pActive;
      pActive = pSeg;
      needSort = 1;
    }else{
      /* Remove a segment */
      if( pActive==pThisEvent->pSeg ){
        pActive = ALWAYS(pActive) ? pActive->pNext : 0;
      }else{
        for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
          if( pSeg->pNext==pThisEvent->pSeg ){
            pSeg->pNext = ALWAYS(pSeg->pNext) ? pSeg->pNext->pNext : 0;
            break;
          }
        }
      }
    }
    pThisEvent = pThisEvent->pNext;
  }
  if( aOverlap[3]==0 ){
    rc = 0;
  }else if( aOverlap[1]!=0 && aOverlap[2]==0 ){
    rc = 3;
  }else if( aOverlap[1]==0 && aOverlap[2]!=0 ){
    rc = 2;
  }else if( aOverlap[1]==0 && aOverlap[2]==0 ){
    rc = 4;
  }else{
    rc = 1;
  }

geopolyOverlapDone:
  sqlite3_free(p);
  return rc;
}